

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

ir_visitor_status __thiscall
anon_unknown.dwarf_4b18a::loop_analysis::visit_enter(loop_analysis *this,ir_if *ir)

{
  if ((this->state).head_sentinel.next != &(this->state).tail_sentinel) {
    this->if_statement_depth = this->if_statement_depth + 1;
  }
  return visit_continue;
}

Assistant:

static inline bool
exec_list_is_empty(const struct exec_list *list)
{
   /* There are three ways to test whether a list is empty or not.
    *
    * - Check to see if the head sentinel's \c next is the tail sentinel.
    * - Check to see if the tail sentinel's \c prev is the head sentinel.
    * - Check to see if the head is the sentinel node by test whether its
    *   \c next pointer is \c NULL.
    *
    * The first two methods tend to generate better code on modern systems
    * because they save a pointer dereference.
    */
   return list->head_sentinel.next == &list->tail_sentinel;
}